

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_ll_uploadtoblob.c
# Opt level: O1

void IoTHubClient_LL_UploadToBlob_Destroy(IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE handle)

{
  char *pcVar1;
  long lVar2;
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  
  if (handle == (IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_ll_uploadtoblob.c"
                 ,"IoTHubClient_LL_UploadToBlob_Destroy",0x4b7,1,"unexpected NULL argument");
      return;
    }
    return;
  }
  if (handle->cred_type - IOTHUB_CREDENTIAL_TYPE_X509 < 2) {
    free((handle->credentials).x509_credentials.x509certificate);
    free((handle->credentials).x509_credentials.x509privatekey);
    free((handle->credentials).x509_credentials.x509privatekeyType);
    lVar2 = 0x38;
  }
  else {
    lVar2 = 0x20;
    if (handle->cred_type != IOTHUB_CREDENTIAL_TYPE_SAS_TOKEN) goto LAB_00129ba9;
  }
  free(*(void **)((long)&handle->deviceId + lVar2));
LAB_00129ba9:
  free(handle->hostname);
  if (handle->certificates != (char *)0x0) {
    free(handle->certificates);
  }
  pcVar1 = (handle->http_proxy_options).host_address;
  if (pcVar1 != (char *)0x0) {
    free(pcVar1);
  }
  pcVar1 = (handle->http_proxy_options).username;
  if (pcVar1 != (char *)0x0) {
    free(pcVar1);
  }
  pcVar1 = (handle->http_proxy_options).password;
  if (pcVar1 != (char *)0x0) {
    free(pcVar1);
  }
  if (handle->networkInterface != (char *)0x0) {
    free(handle->networkInterface);
  }
  free(handle);
  return;
}

Assistant:

void IoTHubClient_LL_UploadToBlob_Destroy(IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE handle)
{
    if (handle == NULL)
    {
        LogError("unexpected NULL argument");
    }
    else
    {
        IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA* upload_data = (IOTHUB_CLIENT_LL_UPLOADTOBLOB_HANDLE_DATA*)handle;

        if (upload_data->cred_type == IOTHUB_CREDENTIAL_TYPE_X509 || upload_data->cred_type == IOTHUB_CREDENTIAL_TYPE_X509_ECC)
        {
            free(upload_data->credentials.x509_credentials.x509certificate);
            free(upload_data->credentials.x509_credentials.x509privatekey);
            free(upload_data->credentials.x509_credentials.x509privatekeyType);
            free(upload_data->credentials.x509_credentials.engine);
        }
        else if (upload_data->cred_type == IOTHUB_CREDENTIAL_TYPE_SAS_TOKEN)
        {
            free(upload_data->credentials.supplied_sas_token);
        }

        free((void*)upload_data->hostname);
        if (upload_data->certificates != NULL)
        {
            free(upload_data->certificates);
        }
        if (upload_data->http_proxy_options.host_address != NULL)
        {
            free((char *)upload_data->http_proxy_options.host_address);
        }
        if (upload_data->http_proxy_options.username != NULL)
        {
            free((char *)upload_data->http_proxy_options.username);
        }
        if (upload_data->http_proxy_options.password != NULL)
        {
            free((char *)upload_data->http_proxy_options.password);
        }
        if (upload_data->networkInterface != NULL)
        {
            free((char*)upload_data->networkInterface);
        }
        free(upload_data);
    }
}